

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Metadata.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_MetadataInteger(X3DImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pFVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar6;
  CX3DImporter_NodeElement_MetaInteger *pCVar7;
  allocator local_111;
  string local_110;
  undefined4 local_f0;
  allocator local_e9;
  undefined1 local_e8 [8];
  string an;
  uint local_b4;
  int idx_end;
  int idx;
  CX3DImporter_NodeElement *ne;
  vector<int,_std::allocator<int>_> value;
  string reference;
  string name;
  string use;
  string def;
  X3DImporter *this_local;
  
  std::__cxx11::string::string((string *)(use.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(reference.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&ne);
  _idx_end = (CX3DImporter_NodeElement_MetaInteger *)0x0;
  local_b4 = 0;
  pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                     (&this->mReader);
  iVar2 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  for (; (int)local_b4 < iVar2; local_b4 = local_b4 + 1) {
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                      (pFVar5,(ulong)local_b4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_e8,(char *)CONCAT44(extraout_var,iVar3),&local_e9);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_e8,"DEF");
    if (bVar1) {
      pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                        (pFVar5,(ulong)local_b4);
      std::__cxx11::string::operator=
                ((string *)(use.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_00,iVar3));
      local_f0 = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_e8,"USE");
      if (bVar1) {
        pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                          (pFVar5,(ulong)local_b4);
        std::__cxx11::string::operator=
                  ((string *)(name.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_01,iVar3)
                  );
        local_f0 = 4;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_e8,"bboxCenter");
        if (bVar1) {
          local_f0 = 4;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_e8,"bboxSize");
          if (bVar1) {
            local_f0 = 4;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_e8,"containerField");
            if (bVar1) {
              local_f0 = 4;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_e8,"name");
              if (bVar1) {
                pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                         operator->(&this->mReader);
                iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader
                          [6])(pFVar5,(ulong)local_b4);
                std::__cxx11::string::operator=
                          ((string *)(reference.field_2._M_local_buf + 8),
                           (char *)CONCAT44(extraout_var_02,iVar3));
                local_f0 = 4;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_e8,"reference");
                if (bVar1) {
                  pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                           ::operator->(&this->mReader);
                  iVar3 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>).
                            _vptr_IIrrXMLReader[6])(pFVar5,(ulong)local_b4);
                  std::__cxx11::string::operator=
                            ((string *)
                             &value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                             (char *)CONCAT44(extraout_var_03,iVar3));
                  local_f0 = 4;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_e8,"value");
                  if (bVar1) {
                    XML_ReadNode_GetAttrVal_AsArrI32
                              (this,local_b4,(vector<int,_std::allocator<int>_> *)&ne);
                    local_f0 = 4;
                  }
                  else {
                    Throw_IncorrectAttr(this,(string *)local_e8);
                    local_f0 = 0;
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)local_e8);
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    XML_CheckNode_MustBeEmpty(this);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      Throw_DEF_And_USE(this);
    }
    bVar1 = FindNodeElement(this,(string *)((long)&name.field_2 + 8),ENET_MetaInteger,
                            (CX3DImporter_NodeElement **)&idx_end);
    if (!bVar1) {
      Throw_USE_NotFound(this,(string *)((long)&name.field_2 + 8));
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
  }
  else {
    pCVar7 = (CX3DImporter_NodeElement_MetaInteger *)operator_new(0xa8);
    CX3DImporter_NodeElement_MetaInteger::CX3DImporter_NodeElement_MetaInteger
              (pCVar7,this->NodeElement_Cur);
    _idx_end = pCVar7;
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::__cxx11::string::operator=
                ((string *)
                 &(_idx_end->super_CX3DImporter_NodeElement_Meta).super_CX3DImporter_NodeElement.ID,
                 (string *)(use.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::operator=
              ((string *)&(_idx_end->super_CX3DImporter_NodeElement_Meta).Reference,
               (string *)
               &value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    std::vector<int,_std::allocator<int>_>::operator=
              (&_idx_end->Value,(vector<int,_std::allocator<int>_> *)&ne);
    pFVar5 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                       (&this->mReader);
    uVar4 = (*(pFVar5->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar7 = _idx_end;
    if ((uVar4 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_110,"MetadataInteger",&local_111);
      ParseNode_Metadata(this,(CX3DImporter_NodeElement *)pCVar7,&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
    }
    else {
      std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
      push_back(&this->NodeElement_Cur->Child,(value_type *)&idx_end);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    push_back(&this->NodeElement_List,(value_type *)&idx_end);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&ne);
  std::__cxx11::string::~string
            ((string *)
             &value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::__cxx11::string::~string((string *)(reference.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(use.field_2._M_local_buf + 8));
  return;
}

Assistant:

void X3DImporter::ParseNode_MetadataInteger()
{
    std::string def, use;
    std::string name, reference;
    std::vector<int32_t> value;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_RET("name", name, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("reference", reference, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_REF("value", value, XML_ReadNode_GetAttrVal_AsArrI32);
	MACRO_ATTRREAD_LOOPEND;

	MACRO_METADATA_FINDCREATE(def, use, reference, value, ne, CX3DImporter_NodeElement_MetaInteger, "MetadataInteger", ENET_MetaInteger);
}